

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getSolution
          (MultipleShootingTranscription *this,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *states,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controls)

{
  bool bVar1;
  ulong uVar2;
  pointer paVar3;
  size_type __new_size;
  long lVar4;
  long lVar5;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> solutionMap;
  MeshPointOrigin first;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_f0;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  local_d8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_90;
  MeshPointOrigin local_78;
  
  bVar1 = this->m_solved;
  if (bVar1 == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getSolution",
               "First you need to solve the problem once.");
  }
  else {
    __new_size = this->m_totalMeshes - 1;
    if ((long)(states->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(states->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (states,__new_size);
    }
    if ((long)(controls->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(controls->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start >> 5 != this->m_controlMeshes) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (controls,this->m_controlMeshes);
    }
    toEigen(&local_f0,&this->m_solution);
    MeshPointOrigin::FirstPoint();
    lVar5 = 0;
    lVar4 = 0;
    for (paVar3 = (this->m_meshPoints).
                  super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar3 != (this->m_meshPointsEnd)._M_current; paVar3 = paVar3 + 1) {
      if ((paVar3->origin).m_priority != local_78.m_priority) {
        uVar2 = iDynTree::VectorDynSize::size();
        if (uVar2 != this->m_nx) {
          iDynTree::VectorDynSize::resize
                    ((ulong)((states->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar5 * 0x20));
          uVar2 = (ulong)(uint)this->m_nx;
        }
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_startRow.m_value = (long)(uint)paVar3->stateIndex;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
        .m_data = (PointerType)
                  (local_d8.
                   super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
                   .m_startRow.m_value * 8 + local_f0._0_8_);
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
        .m_rows.m_value = uVar2 & 0xffffffff;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._16_1_ = local_f0._16_1_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._0_8_ = local_f0._0_8_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._8_8_ = local_f0._8_8_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_outerStride = local_f0._8_8_;
        toEigen(&local_90,
                (states->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar5 * 0x20);
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>>
                  (&local_90,&local_d8);
        lVar5 = lVar5 + 1;
      }
      if (paVar3->type == Control) {
        uVar2 = iDynTree::VectorDynSize::size();
        if (uVar2 != this->m_nu) {
          iDynTree::VectorDynSize::resize
                    ((ulong)((controls->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar4 * 0x20));
          uVar2 = this->m_nu;
        }
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_startRow.m_value = paVar3->controlIndex;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
        .m_data = (PointerType)
                  (local_d8.
                   super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
                   .m_startRow.m_value * 8 + local_f0._0_8_);
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._16_1_ = local_f0._16_1_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._0_8_ = local_f0._0_8_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_xpr._8_8_ = local_f0._8_8_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .m_outerStride = local_f0._8_8_;
        local_d8.
        super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
        .m_rows.m_value = uVar2;
        toEigen(&local_90,
                (controls->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar4 * 0x20);
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>>
                  (&local_90,&local_d8);
        lVar4 = lVar4 + 1;
      }
    }
    MeshPointOrigin::~MeshPointOrigin(&local_78);
  }
  return bVar1;
}

Assistant:

bool getSolution(std::vector<VectorDynSize>& states, std::vector<VectorDynSize>& controls) {
                if (!(m_solved)){
                    reportError("MultipleShootingTranscription", "getSolution", "First you need to solve the problem once.");
                    return false;
                }

                if (states.size() != (m_totalMeshes - 1)) {
                    states.resize((m_totalMeshes - 1));
                }

                if (controls.size() != m_controlMeshes) {
                    controls.resize(m_controlMeshes);
                }

                Eigen::Map<Eigen::VectorXd> solutionMap = toEigen(m_solution);

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){
                    if (mesh->origin != first){
                        if (states[stateIndex].size() !=  m_nx) {
                            states[stateIndex].resize(static_cast<unsigned int>(m_nx));
                        }

                        toEigen(states[stateIndex]) = solutionMap.segment(static_cast<unsigned int>(mesh->stateIndex), static_cast<unsigned int>(m_nx));
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        if (controls[controlIndex].size() !=  m_nu) {
                            controls[controlIndex].resize(static_cast<unsigned int>(m_nu));
                        }

                        toEigen(controls[controlIndex]) = solutionMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), static_cast<Eigen::Index>(m_nu));
                        controlIndex++;
                    }
                }

                return true;
            }